

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O0

bool __thiscall
Js::SourceDynamicProfileManager::ShouldSaveToProfileCache
          (SourceDynamicProfileManager *this,SourceContextInfo *info)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BVIndex BVar4;
  SimpleDataCacheWrapper *this_00;
  BVFixed **ppBVar5;
  BVFixed *pBVar6;
  undefined4 *puVar7;
  uint saveThreshold;
  uint numberOfBitsDifferent;
  SourceContextInfo *info_local;
  SourceDynamicProfileManager *this_local;
  
  if ((this->isNonCachableScript & 1U) == 0) {
    this_00 = Memory::WriteBarrierPtr<Js::SimpleDataCacheWrapper>::operator->
                        (&this->dataCacheWrapper);
    uVar3 = SimpleDataCacheWrapper::BlocksWritten(this_00);
    if (uVar3 == 0) {
      ppBVar5 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                          ((WriteBarrierPtr *)&this->startupFunctions);
      if (*ppBVar5 != (BVFixed *)0x0) {
        pBVar6 = Memory::WriteBarrierPtr<BVFixed>::operator->(&this->startupFunctions);
        BVar4 = BVFixed::Length(pBVar6);
        if (5 < BVar4) {
          ppBVar5 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                              ((WriteBarrierPtr *)&this->cachedStartupFunctions);
          if (*ppBVar5 != (BVFixed *)0x0) {
            ppBVar5 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                                ((WriteBarrierPtr *)&this->cachedStartupFunctions);
            pBVar6 = *ppBVar5;
            ppBVar5 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                                ((WriteBarrierPtr *)&this->startupFunctions);
            if (pBVar6 == *ppBVar5) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                          ,0xf4,"(cachedStartupFunctions != startupFunctions)",
                                          "Ensure they are not shallow copies of each other - Reuse() does this for dynamic sources. We should not be invoked for dynamic sources"
                                         );
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            pBVar6 = Memory::WriteBarrierPtr<const_BVFixed>::operator->
                               (&this->cachedStartupFunctions);
            ppBVar5 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                                ((WriteBarrierPtr *)&this->startupFunctions);
            uVar3 = BVFixed::DiffCount(pBVar6,*ppBVar5);
            pBVar6 = Memory::WriteBarrierPtr<const_BVFixed>::operator->
                               (&this->cachedStartupFunctions);
            BVar4 = BVFixed::Length(pBVar6);
            if (uVar3 <= (BVar4 * 0xf) / 100) {
              if ((DAT_01ec73ca & 1) != 0) {
                Output::Trace(DynamicProfilePhase,
                              L"Skipping save of profile. Number of functions different: %d %s\n",
                              (ulong)uVar3,(info->field_5).field_0.url);
              }
              return false;
            }
            if ((DAT_01ec73ca & 1) != 0) {
              Output::Trace(DynamicProfilePhase,L"Number of functions different: %d \n",(ulong)uVar3
                           );
            }
          }
          return true;
        }
      }
      if ((DAT_01ec73ca & 1) != 0) {
        Output::Trace(DynamicProfilePhase,
                      L"Skipping save of profile. Small number of functions. %s\n",
                      (info->field_5).field_0.url);
      }
      this_local._7_1_ = false;
    }
    else {
      if ((DAT_01ec73ca & 1) != 0) {
        Output::Trace(DynamicProfilePhase,
                      L"Saving profile. There are other blocks in the cache. %s\n",
                      (info->field_5).field_0.url);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    if ((DAT_01ec73ca & 1) != 0) {
      Output::Trace(DynamicProfilePhase,L"Skipping save of profile. Non-cacheable resource. %s\n",
                    (info->field_5).field_0.url);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SourceDynamicProfileManager::ShouldSaveToProfileCache(SourceContextInfo* info) const
    {
        if(isNonCachableScript)
        {
            OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Skipping save of profile. Non-cacheable resource. %s\n"), info->url);
            return false;
        }

        if (dataCacheWrapper->BlocksWritten() > 0)
        {
            OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Saving profile. There are other blocks in the cache. %s\n"), info->url);
            return true;
        }

        if(!startupFunctions || startupFunctions->Length() <= DEFAULT_CONFIG_MinProfileCacheSize)
        {
            OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Skipping save of profile. Small number of functions. %s\n"), info->url);
            return false;
        }

        if(cachedStartupFunctions)
        {
            AssertMsg(cachedStartupFunctions != startupFunctions, "Ensure they are not shallow copies of each other - Reuse() does this for dynamic sources. We should not be invoked for dynamic sources");
            uint numberOfBitsDifferent = cachedStartupFunctions->DiffCount(startupFunctions);
            uint saveThreshold = (cachedStartupFunctions->Length() * DEFAULT_CONFIG_ProfileDifferencePercent) / 100;
            if(numberOfBitsDifferent <= saveThreshold)
            {
                OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Skipping save of profile. Number of functions different: %d %s\n"), numberOfBitsDifferent, info->url);
                return false;
            }
            else
            {
                OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Number of functions different: %d \n"), numberOfBitsDifferent);
            }
        }
        return true;
    }